

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O0

ParseStatus ReadHeader(MemBuffer_conflict *mem)

{
  uint32_t uVar1;
  size_t sVar2;
  int *piVar3;
  uint8_t *puVar4;
  MemBuffer_conflict *in_RDI;
  uint32_t riff_size;
  size_t min_size;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  ParseStatus local_4;
  
  sVar2 = MemDataSize(in_RDI);
  if (sVar2 < 0x14) {
    local_4 = PARSE_NEED_MORE_DATA;
  }
  else {
    piVar3 = (int *)GetBuffer(in_RDI);
    if ((*piVar3 == 0x46464952) && (puVar4 = GetBuffer(in_RDI), *(int *)(puVar4 + 8) == 0x50424557))
    {
      GetBuffer(in_RDI);
      uVar1 = GetLE32((uint8_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      if (uVar1 < 8) {
        return PARSE_ERROR;
      }
      if (0xfffffff6 < uVar1) {
        return PARSE_ERROR;
      }
      in_RDI->riff_end_ = (ulong)(uVar1 + 8);
      if (in_RDI->riff_end_ < in_RDI->buf_size_) {
        in_RDI->end_ = in_RDI->riff_end_;
        in_RDI->buf_size_ = in_RDI->riff_end_;
      }
      Skip(in_RDI,0xc);
      return PARSE_OK;
    }
    local_4 = PARSE_ERROR;
  }
  return local_4;
}

Assistant:

static ParseStatus ReadHeader(MemBuffer* const mem) {
  const size_t min_size = RIFF_HEADER_SIZE + CHUNK_HEADER_SIZE;
  uint32_t riff_size;

  // Basic file level validation.
  if (MemDataSize(mem) < min_size) return PARSE_NEED_MORE_DATA;
  if (memcmp(GetBuffer(mem), "RIFF", CHUNK_SIZE_BYTES) ||
      memcmp(GetBuffer(mem) + CHUNK_HEADER_SIZE, "WEBP", CHUNK_SIZE_BYTES)) {
    return PARSE_ERROR;
  }

  riff_size = GetLE32(GetBuffer(mem) + TAG_SIZE);
  if (riff_size < CHUNK_HEADER_SIZE) return PARSE_ERROR;
  if (riff_size > MAX_CHUNK_PAYLOAD) return PARSE_ERROR;

  // There's no point in reading past the end of the RIFF chunk
  mem->riff_end_ = riff_size + CHUNK_HEADER_SIZE;
  if (mem->buf_size_ > mem->riff_end_) {
    mem->buf_size_ = mem->end_ = mem->riff_end_;
  }

  Skip(mem, RIFF_HEADER_SIZE);
  return PARSE_OK;
}